

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_WriteTimingInfo(FILE *pFile,Abc_Ntk_t *pNtk)

{
  float fVar1;
  float fVar2;
  Abc_Time_t *pAVar3;
  Abc_Time_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Time_t *pAVar6;
  char *pcVar7;
  int iVar8;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    return;
  }
  fputc(10,(FILE *)pFile);
  fVar1 = pNtk->AndGateDelay;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fprintf((FILE *)pFile,".and_gate_delay %g\n",(double)fVar1);
  }
  pAVar3 = Abc_NtkReadDefaultArrival(pNtk);
  fprintf((FILE *)pFile,".default_input_arrival %g %g\n",(double)pAVar3->Rise,(double)pAVar3->Fall);
  pAVar4 = Abc_NtkReadDefaultRequired(pNtk);
  fprintf((FILE *)pFile,".default_output_required %g %g\n",(double)pAVar4->Rise,(double)pAVar4->Fall
         );
  fputc(10,(FILE *)pFile);
  for (iVar8 = 0; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
    pAVar5 = Abc_NtkPi(pNtk,iVar8);
    pAVar6 = Abc_NodeReadArrival(pAVar5);
    if ((pAVar6->Rise != pAVar3->Rise) || (NAN(pAVar6->Rise) || NAN(pAVar3->Rise))) {
LAB_002e47d2:
      pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
      fprintf((FILE *)pFile,".input_arrival %s %g %g\n",(double)pAVar6->Rise,(double)pAVar6->Fall,
              pcVar7);
    }
    else if ((pAVar6->Fall != pAVar3->Fall) || (NAN(pAVar6->Fall) || NAN(pAVar3->Fall)))
    goto LAB_002e47d2;
  }
  for (iVar8 = 0; iVar8 < pNtk->vPos->nSize; iVar8 = iVar8 + 1) {
    pAVar5 = Abc_NtkPo(pNtk,iVar8);
    pAVar3 = Abc_NodeReadRequired(pAVar5);
    if ((pAVar3->Rise != pAVar4->Rise) || (NAN(pAVar3->Rise) || NAN(pAVar4->Rise))) {
LAB_002e4857:
      pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
      fprintf((FILE *)pFile,".output_required %s %g %g\n",(double)pAVar3->Rise,(double)pAVar3->Fall,
              pcVar7);
    }
    else if ((pAVar3->Fall != pAVar4->Fall) || (NAN(pAVar3->Fall) || NAN(pAVar4->Fall)))
    goto LAB_002e4857;
  }
  fputc(10,(FILE *)pFile);
  pAVar3 = Abc_NtkReadDefaultInputDrive(pNtk);
  fVar1 = pAVar3->Rise;
  fVar2 = pAVar3->Fall;
  if ((((fVar1 != 0.0) || (NAN(fVar1))) || (fVar2 != 0.0)) || (NAN(fVar2))) {
    fprintf((FILE *)pFile,".default_input_drive %g %g\n",(double)fVar1,(double)fVar2);
  }
  iVar8 = 0;
  pAVar4 = Abc_NodeReadInputDrive(pNtk,0);
  if (pAVar4 != (Abc_Time_t *)0x0) {
    for (; iVar8 < pNtk->vPis->nSize; iVar8 = iVar8 + 1) {
      pAVar5 = Abc_NtkPi(pNtk,iVar8);
      pAVar4 = Abc_NodeReadInputDrive(pNtk,iVar8);
      if ((pAVar4->Rise != pAVar3->Rise) || (NAN(pAVar4->Rise) || NAN(pAVar3->Rise))) {
LAB_002e493a:
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanouts).pArray]);
        fprintf((FILE *)pFile,".input_drive %s %g %g\n",(double)pAVar4->Rise,(double)pAVar4->Fall,
                pcVar7);
      }
      else if ((pAVar4->Fall != pAVar3->Fall) || (NAN(pAVar4->Fall) || NAN(pAVar3->Fall)))
      goto LAB_002e493a;
    }
  }
  pAVar3 = Abc_NtkReadDefaultOutputLoad(pNtk);
  fVar1 = pAVar3->Rise;
  fVar2 = pAVar3->Fall;
  if (((fVar1 != 0.0) || (NAN(fVar1))) || ((fVar2 != 0.0 || (NAN(fVar2))))) {
    fprintf((FILE *)pFile,".default_output_load %g %g\n",(double)fVar1,(double)fVar2);
  }
  iVar8 = 0;
  pAVar4 = Abc_NodeReadOutputLoad(pNtk,0);
  if (pAVar4 != (Abc_Time_t *)0x0) {
    for (; iVar8 < pNtk->vPos->nSize; iVar8 = iVar8 + 1) {
      pAVar5 = Abc_NtkPo(pNtk,iVar8);
      pAVar4 = Abc_NodeReadOutputLoad(pNtk,iVar8);
      if ((pAVar4->Rise != pAVar3->Rise) || (NAN(pAVar4->Rise) || NAN(pAVar3->Rise))) {
LAB_002e4a11:
        pcVar7 = Abc_ObjName((Abc_Obj_t *)pAVar5->pNtk->vObjs->pArray[*(pAVar5->vFanins).pArray]);
        fprintf((FILE *)pFile,".output_load %s %g %g\n",(double)pAVar4->Rise,(double)pAVar4->Fall,
                pcVar7);
      }
      else if ((pAVar4->Fall != pAVar3->Fall) || (NAN(pAVar4->Fall) || NAN(pAVar3->Fall)))
      goto LAB_002e4a11;
    }
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Io_WriteTimingInfo( FILE * pFile, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    Abc_Time_t * pTime, * pTimeDefIn, * pTimeDefOut;
    int i;

    if ( pNtk->pManTime == NULL )
        return;

    fprintf( pFile, "\n" );
    if ( pNtk->AndGateDelay != 0.0 )
        fprintf( pFile, ".and_gate_delay %g\n", pNtk->AndGateDelay );
    pTimeDefIn = Abc_NtkReadDefaultArrival( pNtk );
    //if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_arrival %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    pTimeDefOut = Abc_NtkReadDefaultRequired( pNtk );
    //if ( pTimeDefOut->Rise != ABC_INFINITY || pTimeDefOut->Fall != ABC_INFINITY )
        fprintf( pFile, ".default_output_required %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );

    fprintf( pFile, "\n" );
    Abc_NtkForEachPi( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadArrival(pNode);
        if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
            continue;
        fprintf( pFile, ".input_arrival %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
    }
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        pTime = Abc_NodeReadRequired(pNode);
        if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
            continue;
        fprintf( pFile, ".output_required %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
    }

    fprintf( pFile, "\n" );
    pTimeDefIn = Abc_NtkReadDefaultInputDrive( pNtk );
    if ( pTimeDefIn->Rise != 0.0 || pTimeDefIn->Fall != 0.0 )
        fprintf( pFile, ".default_input_drive %g %g\n", pTimeDefIn->Rise, pTimeDefIn->Fall );
    if ( Abc_NodeReadInputDrive( pNtk, 0 ) )
        Abc_NtkForEachPi( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadInputDrive( pNtk, i );
            if ( pTime->Rise == pTimeDefIn->Rise && pTime->Fall == pTimeDefIn->Fall )
                continue;
            fprintf( pFile, ".input_drive %s %g %g\n", Abc_ObjName(Abc_ObjFanout0(pNode)), pTime->Rise, pTime->Fall );
        }

    pTimeDefOut = Abc_NtkReadDefaultOutputLoad( pNtk );
    if ( pTimeDefOut->Rise != 0.0 || pTimeDefOut->Fall != 0.0 )
        fprintf( pFile, ".default_output_load %g %g\n", pTimeDefOut->Rise, pTimeDefOut->Fall );
    if ( Abc_NodeReadOutputLoad( pNtk, 0 ) )
        Abc_NtkForEachPo( pNtk, pNode, i )
        {
            pTime = Abc_NodeReadOutputLoad( pNtk, i );
            if ( pTime->Rise == pTimeDefOut->Rise && pTime->Fall == pTimeDefOut->Fall )
                continue;
            fprintf( pFile, ".output_load %s %g %g\n", Abc_ObjName(Abc_ObjFanin0(pNode)), pTime->Rise, pTime->Fall );
        }

    fprintf( pFile, "\n" );
}